

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

float ssd(qnode_ptr_t f,qnode_ptr_t g,int x1,int y1,int x2,int y2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  
  iVar4 = kera.m / -2;
  lVar2 = (long)iVar4;
  lVar1 = (long)(kera.m / 2);
  fVar13 = 0.0;
  for (lVar7 = lVar2; lVar7 <= lVar1; lVar7 = lVar7 + 1) {
    lVar3 = lVar7 + x1;
    iVar11 = 0;
    if (-1 < lVar3) {
      iVar11 = (int)lVar3;
      if (f->sizy <= lVar3) {
        iVar11 = f->sizy + -1;
      }
    }
    lVar3 = lVar7 + x2;
    iVar6 = 0;
    if (-1 < lVar3) {
      iVar6 = (int)lVar3;
      if (g->sizy <= lVar3) {
        iVar6 = g->sizy + -1;
      }
    }
    pfVar12 = kera.k + lVar2 + lVar1;
    iVar5 = y2 + iVar4;
    iVar9 = y1 + iVar4;
    for (lVar3 = lVar2; lVar3 <= lVar1; lVar3 = lVar3 + 1) {
      iVar10 = 0;
      if ((-1 < y1 + lVar3) && (iVar10 = f->sizx + -1, y1 + lVar3 < (long)f->sizx)) {
        iVar10 = iVar9;
      }
      iVar8 = 0;
      if ((-1 < y2 + lVar3) && (iVar8 = g->sizx + -1, y2 + lVar3 < (long)g->sizx)) {
        iVar8 = iVar5;
      }
      fVar14 = (*f->lap_ptr)[f->res * iVar11 + iVar10] - (*g->lap_ptr)[g->res * iVar6 + iVar8];
      fVar13 = fVar14 * fVar14 * kera.k[lVar7 + lVar1] * *pfVar12 + fVar13;
      iVar9 = iVar9 + 1;
      iVar5 = iVar5 + 1;
      pfVar12 = pfVar12 + 1;
    }
  }
  return fVar13 / (kera.f * kera.f);
}

Assistant:

float ssd(f,g,x1,y1,x2,y2)
qnode_ptr_t f, g ;
int x1, y1, x2, y2 ;

{ extern kernel_t kera ;
  int k1, k2, xr1, yr1, xr2, yr2 ;
  float s ;

  s = 0.0 ;
  for (k1 = -kera.m/2 ; k1 <= kera.m/2; k1++) {
    if (x1 + k1 < 0) {
      xr1 = 0 ;
    }
    else {
      if (x1 + k1 >= f->sizy) {
        xr1 = f->sizy - 1 ;
      }
      else {
        xr1 = x1 + k1 ;
      }
    }
    if (x2 + k1 < 0) {
      xr2 = 0 ;
    }
    else {
      if (x2 + k1 >= g->sizy) {
        xr2 = g->sizy - 1 ;
      }
      else {
        xr2 = x2 + k1 ;
      }
    }
    for (k2 = -kera.m/2 ; k2 <= kera.m/2 ; k2++) {
      if (y1 + k2 < 0) {
        yr1 = 0 ;
      }
      else {
        if (y1 + k2 >= f->sizx) {
          yr1 = f->sizx - 1 ;
        }
        else {
          yr1 = y1 + k2 ;
        }
      }
      if (y2 + k2 < 0) {
        yr2 = 0 ;
      }
      else {
        if (y2 + k2 >= g->sizx) {
          yr2 = g->sizx - 1 ;
        }
        else {
          yr2 = y2 + k2 ;
        }
      }
      s = s + (float)kera.k[k1+kera.m/2]*(float)kera.k[k2+kera.m/2]*
      pow(((*f->lap_ptr)[f->res*xr1 + yr1] -
           (*g->lap_ptr)[g->res*xr2 + yr2]),2.0) ;
    }
  }
  return(s/(kera.f*kera.f)) ;
}